

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

int BuiltinCallLineSpecial
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int iVar1;
  long lVar2;
  int iVar3;
  code *pcStack_40;
  int v [5];
  
  if (4 < numparam - 3U) {
    pcStack_40 = (code *)0x533ef6;
    __assert_fail("numparam > 2 && numparam < 8",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0x1dd9,
                  "int BuiltinCallLineSpecial(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if ((param->field_0).field_3.Type != '\0') {
    pcStack_40 = (code *)0x533f15;
    __assert_fail("param[0].Type == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0x1dda,
                  "int BuiltinCallLineSpecial(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[1].field_0.field_3.Type != '\x03') {
    pcStack_40 = (code *)0x533f34;
    __assert_fail("param[1].Type == REGT_POINTER",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0x1ddb,
                  "int BuiltinCallLineSpecial(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  v[0] = 0;
  v[1] = 0;
  v[2] = 0;
  v[3] = 0;
  v[4] = 0;
  lVar2 = 8;
  do {
    *(undefined4 *)((long)v + lVar2 + -8) = *(undefined4 *)((long)&param->field_0 + lVar2 * 4);
    lVar2 = lVar2 + 4;
  } while ((ulong)(uint)numparam << 2 != lVar2);
  iVar3 = 0;
  iVar1 = P_ExecuteSpecial((param->field_0).i,(line_t *)0x0,(AActor *)param[1].field_0.field_1.a,
                           false,v[0],v[1],(int)v._8_8_,v[3],v[4]);
  if (0 < numret) {
    if (ret == (VMReturn *)0x0) {
      pcStack_40 = (code *)0x533f53;
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                    ,0x1de2,
                    "int BuiltinCallLineSpecial(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    if (ret->RegType != '\0') {
      pcStack_40 = FxActionSpecialCall::Emit;
      __assert_fail("RegType == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                    ,0x13f,"void VMReturn::SetInt(int)");
    }
    *(int *)ret->Location = iVar1;
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int BuiltinCallLineSpecial(VMValue *param, TArray<VMValue> &defaultparam, int numparam, VMReturn *ret, int numret)
{
	assert(numparam > 2 && numparam < 8);
	assert(param[0].Type == REGT_INT);
	assert(param[1].Type == REGT_POINTER);
	int v[5] = { 0 };

	for (int i = 2; i < numparam; ++i)
	{
		v[i - 2] = param[i].i;
	}
	ACTION_RETURN_INT(P_ExecuteSpecial(param[0].i, nullptr, reinterpret_cast<AActor*>(param[1].a), false, v[0], v[1], v[2], v[3], v[4]));
}